

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedEnum::GenerateByteSize
          (RepeatedEnum *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  byte bVar2;
  LogMessage *pLVar3;
  Sub *local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  undefined1 local_189;
  anon_class_16_2_fd512ddd_for_cb local_188 [2];
  allocator<char> local_161;
  string local_160;
  Sub *local_140;
  Sub local_138;
  iterator local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined1 local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  RepeatedEnum *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  if ((this->has_cached_size_ & 1U) == 0) {
    local_189 = 1;
    local_140 = &local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"tag_size",&local_161);
    local_188[0].p = &local_18;
    local_188[0].this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::RepeatedEnum::GenerateByteSize(google::protobuf::io::Printer*)const::__0>
              (&local_138,&local_160,local_188);
    local_189 = 0;
    local_80 = &local_138;
    local_78 = 1;
    v._M_len = 1;
    v._M_array = local_80;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_70._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a0,
               "\n        std::size_t data_size =\n            ::_pbi::WireFormatLite::EnumSize(this_._internal_$name$());\n        std::size_t tag_size = $tag_size$;\n        total_size += data_size + tag_size;\n      "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (p,local_70._M_allocated_capacity,local_70._8_8_,local_1a0._M_len,local_1a0._M_str);
    local_1d0 = (Sub *)&local_80;
    do {
      local_1d0 = local_1d0 + -1;
      io::Printer::Sub::~Sub(local_1d0);
    } while (local_1d0 != &local_138);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  else {
    bVar2 = google::protobuf::FieldDescriptor::is_packed();
    local_41 = 0;
    if (((bVar2 ^ 0xff) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"field_->is_packed()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/enum_field.cc"
                 ,0x20a,local_40._M_len,local_40._M_str);
      local_41 = 1;
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar3);
    }
    pPVar1 = local_18;
    if ((local_41 & 1) != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,
               "\n      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(\n          this_._internal_$name$(), $kTagBytes$, this_.$cached_size_$);\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
  }
  return;
}

Assistant:

void RepeatedEnum::GenerateByteSize(io::Printer* p) const {
  if (has_cached_size_) {
    ABSL_CHECK(field_->is_packed());
    p->Emit(R"cc(
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_$name$(), $kTagBytes$, this_.$cached_size_$);
    )cc");
    return;
  }
  p->Emit(
      {
          {"tag_size",
           [&] {
             if (field_->is_packed()) {
               p->Emit(R"cc(
                 data_size == 0
                     ? 0
                     : $kTagBytes$ + ::_pbi::WireFormatLite::Int32Size(
                                         static_cast<int32_t>(data_size));
               )cc");
             } else {
               p->Emit(R"cc(
                 std::size_t{$kTagBytes$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             }
           }},
      },
      R"cc(
        std::size_t data_size =
            ::_pbi::WireFormatLite::EnumSize(this_._internal_$name$());
        std::size_t tag_size = $tag_size$;
        total_size += data_size + tag_size;
      )cc");
}